

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_general.h
# Opt level: O3

Violation __thiscall
mp::ComplementarityConstraint<mp::AlgebraicExpression<mp::QuadAndLinTerms>>::
ComputeViolation<mp::VarInfoImpl<std::vector<double,std::allocator<double>>>>
          (ComplementarityConstraint<mp::AlgebraicExpression<mp::QuadAndLinTerms>> *this,
          VarInfoImpl<std::vector<double,_std::allocator<double>_>_> *x)

{
  double dVar1;
  int iVar2;
  VarInfoImpl<std::vector<double,_std::allocator<double>_>_> *in_RDX;
  longdouble in_ST0;
  double dVar3;
  Violation VVar4;
  
  QuadAndLinTerms::ComputeValue<mp::VarInfoImpl<std::vector<double,std::allocator<double>>>>
            ((longdouble *)(this + 0x20),(QuadAndLinTerms *)x,in_RDX);
  dVar3 = (double)(in_ST0 + (longdouble)*(double *)(this + 0x1d8));
  iVar2 = *(int *)(this + 0x1e0);
  dVar1 = (x->x_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[iVar2];
  if (dVar1 - (x->lb_).data_[iVar2] <= x->feastol_) {
    dVar3 = -dVar3;
  }
  else if (x->feastol_ < -(dVar1 - (x->ub_).data_[iVar2])) {
    dVar3 = ABS(dVar3);
  }
  VVar4.valX_ = 0.0;
  VVar4.viol_ = dVar3;
  return VVar4;
}

Assistant:

Violation ComputeViolation(const VarInfo& x) const {
    auto ve = compl_expr_.ComputeValue(x);
    if (x.is_at_lb(compl_var_))
      return {-ve, 0.0};
    else if (x.is_at_ub(compl_var_))
      return {ve, 0.0};
    return {std::fabs(ve), 0.0};
  }